

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

void flatcc_builder_clear(flatcc_builder_t *B)

{
  int local_1c;
  int i;
  flatcc_iovec_t *buf;
  flatcc_builder_t *B_local;
  
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    (*B->alloc)(B->alloc_context,B->buffers + local_1c,0,0,local_1c);
  }
  if (B->is_default_emitter != 0) {
    flatcc_emitter_clear(&B->default_emit_context);
  }
  if (B->refmap != (flatcc_refmap_t *)0x0) {
    flatcc_refmap_clear(B->refmap);
  }
  memset(B,0,400);
  return;
}

Assistant:

void flatcc_builder_clear(flatcc_builder_t *B)
{
    iovec_t *buf;
    int i;

    for (i = 0; i < FLATCC_BUILDER_ALLOC_BUFFER_COUNT; ++i) {
        buf = B->buffers + i;
        B->alloc(B->alloc_context, buf, 0, 0, i);
    }
    if (B->is_default_emitter) {
        flatcc_emitter_clear(&B->default_emit_context);
    }
    if (B->refmap) {
        flatcc_refmap_clear(B->refmap);
    }
    memset(B, 0, sizeof(*B));
}